

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAux.h
# Opt level: O0

void Assimp::LogFunctions<Assimp::XGLImporter>::ThrowException(string *msg)

{
  DeadlyImportError *this;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *local_10;
  string *msg_local;
  
  local_10 = msg;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  __lhs = Prefix();
  std::operator+(&local_30,__lhs,local_10);
  DeadlyImportError::DeadlyImportError(this,&local_30);
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

static void ThrowException(const std::string& msg)
    {
        throw DeadlyImportError(Prefix()+msg);
    }